

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

int yylex_NORMAL(void)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int32_t iVar8;
  Symbol *name;
  undefined4 extraout_var;
  int iVar9;
  IfStack *pIVar10;
  uint32_t value;
  int unaff_EBP;
  uint32_t n;
  uint32_t ofs;
  byte bVar11;
  RPNCommand RVar12;
  double dVar13;
  char *str;
  
LAB_0010cea7:
  uVar3 = peek();
  bVar1 = true;
  if (uVar3 == 0xffffffff) {
    unaff_EBP = 0;
    goto LAB_0010d7a5;
  }
  shiftChar();
  switch(uVar3) {
  case 9:
  case 0x20:
    goto switchD_0010ced4_caseD_9;
  case 10:
    goto switchD_0010ced4_caseD_a;
  case 0xb:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x27:
  case 0x2e:
  case 0x3f:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5f:
    goto switchD_0010ced4_caseD_b;
  case 0xd:
    iVar7 = peek();
    if (iVar7 == 10) {
      shiftChar();
    }
    goto switchD_0010ced4_caseD_a;
  case 0x21:
    iVar7 = peek();
    unaff_EBP = 0xe;
    if (iVar7 == 0x3d) {
      shiftChar();
      unaff_EBP = 0x15;
    }
    break;
  case 0x22:
    bVar2 = false;
LAB_0010d3f4:
    readString(bVar2);
    unaff_EBP = 4;
    break;
  case 0x23:
    iVar7 = peek();
    if (iVar7 == 0x22) {
      shiftChar();
      bVar2 = true;
      goto LAB_0010d3f4;
    }
switchD_0010ced4_caseD_b:
    if (((0x19 < (uVar3 & 0xffffffdf) - 0x41) && (uVar3 != 0x5f)) && (uVar3 != 0x2e)) {
      if (lexerState->capturing == false) {
        printChar(uVar3);
        error("Unknown character %s\n");
      }
      goto switchD_0010ced4_caseD_9;
    }
    iVar7 = readIdentifier((char)uVar3);
    if ((iVar7 == 0x5e) && (lexerState->lastToken == 0xd)) {
      iVar9 = 1;
      pIVar10 = (IfStack *)&lexerState->ifStack;
      do {
        pIVar10 = pIVar10->next;
        iVar9 = iVar9 + -1;
      } while (pIVar10 != (IfStack *)0x0);
      if (((iVar9 != 0) && (pIVar10 = lexerState->ifStack, pIVar10->ranIfBlock == true)) &&
         (pIVar10->reachedElseBlock == false)) {
        unaff_EBP = skipIfBlock(true);
        break;
      }
    }
    if ((iVar7 - 0x4cU < 0xfffffffe) || (iVar7 != 0x4a)) {
LAB_0010d7a2:
      unaff_EBP = iVar7;
    }
    else if ((lexerState->expandStrings == true) &&
            ((name = sym_FindExactSymbol(yylval.symName), name != (Symbol *)0x0 &&
             (name->type == SYM_EQUS)))) {
      if (name->hasCallback == true) {
        iVar8 = (*(name->field_8).numCallback)();
        str = (char *)CONCAT44(extraout_var,iVar8);
      }
      else {
        str = (name->field_8).field_2.macro;
      }
      if (str == (char *)0x0) {
        __assert_fail("s",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                      ,0x7fe,"yylex_NORMAL");
      }
      if (*str == '\0') {
        bVar1 = false;
      }
      else {
        bVar1 = false;
        beginExpansion(str,false,name->name);
      }
    }
    else {
      unaff_EBP = 0x49;
      if ((lexerState->atLineStart == false) && (iVar9 = peek(), iVar9 != 0x3a)) goto LAB_0010d7a2;
    }
    break;
  case 0x24:
    bVar1 = true;
    uVar3 = 0;
    do {
      iVar7 = peek();
      if (iVar7 - 0x61U < 6) {
        uVar6 = iVar7 - 0x57;
LAB_0010d1cf:
        if (0xfffffff < uVar3) {
          warning(WARNING_LARGE_CONSTANT,"Integer constant is too large\n");
        }
        uVar3 = uVar3 * 0x10 + uVar6;
        bVar1 = false;
LAB_0010d1f2:
        bVar2 = false;
      }
      else {
        if (iVar7 - 0x41U < 6) {
          uVar6 = iVar7 - 0x37;
          goto LAB_0010d1cf;
        }
        uVar6 = iVar7 - 0x30;
        if (uVar6 < 10) goto LAB_0010d1cf;
        if ((iVar7 == 0x5f) && (!bVar1)) goto LAB_0010d1f2;
        bVar2 = true;
      }
      if (bVar2) goto LAB_0010d218;
      shiftChar();
    } while( true );
  case 0x25:
    iVar7 = peek();
    if (iVar7 == 0x3d) {
      shiftChar();
      unaff_EBP = 0x54;
    }
    else if ((iVar7 == binDigits[0]) || (unaff_EBP = 0x21, iVar7 == binDigits[1])) {
      RVar12 = RPN_ADD;
      while( true ) {
        iVar7 = peek();
        iVar9 = 0;
        if ((iVar7 == binDigits[0]) || (iVar9 = 1, iVar7 == binDigits[1])) {
          if ((int)RVar12 < 0) {
            warning(WARNING_LARGE_CONSTANT,"Integer constant is too large\n");
          }
          RVar12 = iVar9 + RVar12 * 2;
          bVar2 = false;
        }
        else {
          bVar2 = iVar7 != 0x5f;
        }
        if (bVar2) break;
        shiftChar();
      }
      goto LAB_0010d0ed;
    }
    break;
  case 0x26:
    uVar3 = peek();
    if (uVar3 == 0x26) {
      shiftChar();
      unaff_EBP = 0xf;
    }
    else if (uVar3 == 0x3d) {
      shiftChar();
      unaff_EBP = 0x57;
    }
    else {
      unaff_EBP = 0x1b;
      if ((uVar3 & 0xfffffff8) == 0x30) {
        RVar12 = readNumber(8,0);
        goto LAB_0010d0ed;
      }
    }
    break;
  case 0x28:
    unaff_EBP = 0xb;
    break;
  case 0x29:
    unaff_EBP = 0xc;
    break;
  case 0x2a:
    iVar7 = peek();
    if (iVar7 == 0x2a) {
      shiftChar();
      unaff_EBP = 0x24;
    }
    else {
      unaff_EBP = 0x1f;
      if (iVar7 == 0x3d) {
        shiftChar();
        unaff_EBP = 0x52;
      }
    }
    break;
  case 0x2b:
    iVar7 = peek();
    unaff_EBP = 0x17;
    if (iVar7 == 0x3d) {
      shiftChar();
      unaff_EBP = 0x50;
    }
    break;
  case 0x2c:
    unaff_EBP = 6;
    break;
  case 0x2d:
    iVar7 = peek();
    unaff_EBP = 0x18;
    if (iVar7 == 0x3d) {
      shiftChar();
      unaff_EBP = 0x51;
    }
    break;
  case 0x2f:
    iVar7 = peek();
    if (iVar7 == 0x2a) {
      shiftChar();
      discardBlockComment();
      goto switchD_0010ced4_caseD_9;
    }
    unaff_EBP = 0x20;
    if (iVar7 == 0x3d) {
      shiftChar();
      unaff_EBP = 0x53;
    }
    break;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    RVar12 = readNumber(10,uVar3 - 0x30);
    iVar7 = peek();
    if (iVar7 == 0x2e) {
      uVar3 = 0;
      uVar6 = 1;
      iVar7 = 0;
      uVar5 = 0;
      do {
        shiftChar();
        uVar4 = peek();
        if (iVar7 == 0) {
          bVar2 = false;
          if (uVar4 == 0x5f) {
LAB_0010cf38:
            iVar7 = 0;
          }
          else {
            bVar2 = false;
            if ((uVar4 & 0xffffffdf) == 0x51) {
              iVar7 = 1;
            }
            else {
              bVar2 = true;
              if (uVar4 - 0x3a < 0xfffffff6) goto LAB_0010cf38;
              if (uVar6 <= (0x2f - uVar4) / 10) {
                uVar5 = (uVar4 + uVar5 * 10) - 0x30;
                uVar6 = uVar6 * 10;
                goto LAB_0010cf56;
              }
              warning(WARNING_LARGE_CONSTANT,"Precision of fixed-point constant is too large\n");
              shiftChar();
              iVar9 = peek();
              iVar7 = 0;
              if (iVar9 == 0x5f || iVar9 - 0x30U < 10) {
                do {
                  shiftChar();
                  iVar9 = peek();
                  iVar7 = 0;
                } while (iVar9 == 0x5f || iVar9 - 0x30U < 10);
              }
            }
          }
        }
        else {
          if (iVar7 == 1 && uVar4 == 0x2e) {
            iVar7 = 2;
          }
          else {
            bVar2 = true;
            if (uVar4 - 0x3a < 0xfffffff6) goto LAB_0010cf58;
            uVar3 = (uint)(byte)(((char)uVar4 + (char)uVar3 * '\n') - 0x30);
          }
LAB_0010cf56:
          bVar2 = false;
        }
LAB_0010cf58:
      } while (!bVar2);
      if ((byte)uVar3 == 0) {
        if (iVar7 != 0) {
          error("Invalid fixed-point constant, no significant digits after \'q\'\n");
        }
        uVar3 = (uint)fixPrecision;
      }
      else if (0x1f < (byte)uVar3) {
        error("Fixed-point constant precision must be between 1 and 31\n");
        uVar3 = (uint)fixPrecision;
      }
      if (RVar12 >> (-((byte)uVar3 + 0x20) & 0x3f) != 0) {
        warning(WARNING_LARGE_CONSTANT,"Magnitude of fixed-point constant is too large\n");
      }
      dVar13 = ldexp(1.0,uVar3);
      dVar13 = round(dVar13 * ((double)uVar5 / (double)uVar6));
      RVar12 = RVar12 << ((byte)uVar3 & 0x1f) | (RPNCommand)(long)dVar13;
    }
    goto LAB_0010d0ed;
  case 0x3a:
    iVar7 = peek();
    if ((iVar7 == 0x2b) || (iVar7 == 0x2d)) {
      ofs = 0;
      do {
        shiftChar();
        ofs = ofs + 1;
        iVar9 = peek();
      } while (iVar9 == (char)iVar7);
      sym_WriteAnonLabelName(yylval.symName,ofs,(char)iVar7 == '-');
      unaff_EBP = 0x4c;
    }
    else {
      unaff_EBP = 7;
      if (iVar7 == 0x3a) {
        shiftChar();
        unaff_EBP = 8;
      }
    }
    break;
  case 0x3b:
    discardComment();
    goto switchD_0010ced4_caseD_9;
  case 0x3c:
    iVar7 = peek();
    if (iVar7 == 0x3c) {
      shiftChar();
      iVar7 = peek();
      unaff_EBP = 0x1c;
      if (iVar7 == 0x3d) {
        shiftChar();
        unaff_EBP = 0x58;
      }
    }
    else {
      unaff_EBP = 0x12;
      if (iVar7 == 0x3d) {
        shiftChar();
        unaff_EBP = 0x14;
      }
    }
    break;
  case 0x3d:
    iVar7 = peek();
    unaff_EBP = 0x4e;
    if (iVar7 == 0x3d) {
      shiftChar();
      unaff_EBP = 0x16;
    }
    break;
  case 0x3e:
    iVar7 = peek();
    if (iVar7 == 0x3e) {
      shiftChar();
      iVar7 = peek();
      if (iVar7 == 0x3e) {
        shiftChar();
        unaff_EBP = 0x1e;
      }
      else {
        unaff_EBP = 0x1d;
        if (iVar7 == 0x3d) {
          shiftChar();
          unaff_EBP = 0x59;
        }
      }
    }
    else {
      unaff_EBP = 0x11;
      if (iVar7 == 0x3d) {
        shiftChar();
        unaff_EBP = 0x13;
      }
    }
    break;
  case 0x40:
    yylval.expr.val._0_2_ = 0x40;
    unaff_EBP = 0x4a;
    break;
  case 0x5b:
    unaff_EBP = 9;
    break;
  case 0x5c:
    readLineContinuation();
switchD_0010ced4_caseD_9:
    lexerState->atLineStart = false;
    bVar1 = false;
    break;
  case 0x5d:
    unaff_EBP = 10;
    break;
  case 0x5e:
    iVar7 = peek();
    unaff_EBP = 0x1a;
    if (iVar7 == 0x3d) {
      shiftChar();
      unaff_EBP = 0x56;
    }
    break;
  case 0x60:
    iVar7 = 0;
    bVar11 = 0;
    RVar12 = RPN_ADD;
    while( true ) {
      iVar9 = peek();
      uVar3 = 0;
      if ((((iVar9 == gfxDigits[0]) || (uVar3 = 1, iVar9 == gfxDigits[1])) ||
          (uVar3 = 2, iVar9 == gfxDigits[2])) || (uVar3 = 3, iVar9 == gfxDigits[3])) {
        if (bVar11 < 8) {
          RVar12 = (uVar3 & 1) + RVar12 * 2;
          iVar7 = (uVar3 >> 1) + iVar7 * 2;
        }
        bVar11 = bVar11 + (bVar11 < 9);
        bVar2 = false;
      }
      else {
        bVar2 = bVar11 == 0 || iVar9 != 0x5f;
      }
      if (bVar2) break;
      shiftChar();
    }
    if (bVar11 == 9) {
      warning(WARNING_LARGE_CONSTANT,
              "Graphics constant is too long, only first 8 pixels considered\n");
    }
    else if (bVar11 == 0) {
      error("Invalid graphics constant, no digits after \'`\'\n");
    }
    RVar12 = RVar12 | iVar7 << 8;
LAB_0010d0ed:
    yylval.compoundEqual = RVar12;
    unaff_EBP = 3;
    break;
  default:
    if (uVar3 == 0x7c) {
      iVar7 = peek();
      if (iVar7 == 0x7c) {
        shiftChar();
        unaff_EBP = 0x10;
      }
      else {
        unaff_EBP = 0x19;
        if (iVar7 == 0x3d) {
          shiftChar();
          unaff_EBP = 0x55;
        }
      }
    }
    else {
      if (uVar3 != 0x7e) goto switchD_0010ced4_caseD_b;
      unaff_EBP = 0x22;
    }
  }
LAB_0010d7a5:
  if (bVar1) {
    return unaff_EBP;
  }
  goto LAB_0010cea7;
LAB_0010d218:
  if (bVar1) {
    error("Invalid integer constant, no digits after \'$\'\n");
  }
  unaff_EBP = 3;
  bVar1 = true;
  yylval.compoundEqual = uVar3;
  goto LAB_0010d7a5;
switchD_0010ced4_caseD_a:
  unaff_EBP = 0xd;
  goto LAB_0010d7a5;
}

Assistant:

static int yylex_NORMAL(void)
{
	for (;;) {
		int c = nextChar();

		switch (c) {
		// Ignore whitespace and comments

		case ';':
			discardComment();
			// fallthrough
		case ' ':
		case '\t':
			break;

		// Handle unambiguous single-char tokens

		case '~':
			return T_OP_NOT;

		case '@':
			yylval.symName[0] = '@';
			yylval.symName[1] = '\0';
			return T_ID;

		case '[':
			return T_LBRACK;
		case ']':
			return T_RBRACK;
		case '(':
			return T_LPAREN;
		case ')':
			return T_RPAREN;
		case ',':
			return T_COMMA;

		// Handle ambiguous 1- or 2-char tokens

		case '+': // Either += or ADD
			if (peek() == '=') {
				shiftChar();
				return T_POP_ADDEQ;
			}
			return T_OP_ADD;

		case '-': // Either -= or SUB
			if (peek() == '=') {
				shiftChar();
				return T_POP_SUBEQ;
			}
			return T_OP_SUB;

		case '*': // Either *=, MUL, or EXP
			switch (peek()) {
			case '=':
				shiftChar();
				return T_POP_MULEQ;
			case '*':
				shiftChar();
				return T_OP_EXP;
			default:
				return T_OP_MUL;
			}

		case '/': // Either /=, DIV, or a block comment
			switch (peek()) {
			case '=':
				shiftChar();
				return T_POP_DIVEQ;
			case '*':
				shiftChar();
				discardBlockComment();
				break;
			default:
				return T_OP_DIV;
			}
			break;

		case '|': // Either |=, binary OR, or logical OR
			switch (peek()) {
			case '=':
				shiftChar();
				return T_POP_OREQ;
			case '|':
				shiftChar();
				return T_OP_LOGICOR;
			default:
				return T_OP_OR;
			}

		case '^': // Either ^= or XOR
			if (peek() == '=') {
				shiftChar();
				return T_POP_XOREQ;
			}
			return T_OP_XOR;

		case '=': // Either assignment or EQ
			if (peek() == '=') {
				shiftChar();
				return T_OP_LOGICEQU;
			}
			return T_POP_EQUAL;

		case '!': // Either a NEQ or negation
			if (peek() == '=') {
				shiftChar();
				return T_OP_LOGICNE;
			}
			return T_OP_LOGICNOT;

		// Handle ambiguous 1-, 2-, or 3-char tokens

		case '<': // Either <<=, LT, LTE, or left shift
			switch (peek()) {
			case '=':
				shiftChar();
				return T_OP_LOGICLE;
			case '<':
				shiftChar();
				if (peek() == '=') {
					shiftChar();
					return T_POP_SHLEQ;
				}
				return T_OP_SHL;
			default:
				return T_OP_LOGICLT;
			}

		case '>': // Either >>=, GT, GTE, or either kind of right shift
			switch (peek()) {
			case '=':
				shiftChar();
				return T_OP_LOGICGE;
			case '>':
				shiftChar();
				switch (peek()) {
				case '=':
					shiftChar();
					return T_POP_SHREQ;
				case '>':
					shiftChar();
					return T_OP_USHR;
				default:
					return T_OP_SHR;
				}
			default:
				return T_OP_LOGICGT;
			}

		case ':': // Either :, ::, or an anonymous label ref
			c = peek();
			switch (c) {
			case ':':
				shiftChar();
				return T_DOUBLE_COLON;
			case '+':
			case '-':
				readAnonLabelRef(c);
				return T_ANON;
			default:
				return T_COLON;
			}

		// Handle numbers

		case '0': // Decimal or fixed-point number
		case '1':
		case '2':
		case '3':
		case '4':
		case '5':
		case '6':
		case '7':
		case '8':
		case '9': {
			uint32_t n = readNumber(10, c - '0');

			if (peek() == '.') {
				shiftChar();
				n = readFractionalPart(n);
			}
			yylval.constValue = n;
			return T_NUMBER;
		}

		case '&': // Either &=, binary AND, logical AND, or an octal constant
			c = peek();
			if (c == '=') {
				shiftChar();
				return T_POP_ANDEQ;
			} else if (c == '&') {
				shiftChar();
				return T_OP_LOGICAND;
			} else if (c >= '0' && c <= '7') {
				yylval.constValue = readNumber(8, 0);
				return T_NUMBER;
			}
			return T_OP_AND;

		case '%': // Either %=, MOD, or a binary constant
			c = peek();
			if (c == '=') {
				shiftChar();
				return T_POP_MODEQ;
			} else if (c == binDigits[0] || c == binDigits[1]) {
				yylval.constValue = readBinaryNumber();
				return T_NUMBER;
			}
			return T_OP_MOD;

		case '$': // Hex constant
			yylval.constValue = readHexNumber();
			return T_NUMBER;

		case '`': // Gfx constant
			yylval.constValue = readGfxConstant();
			return T_NUMBER;

		// Handle strings

		case '"':
			readString(false);
			return T_STRING;

		// Handle newlines and EOF

		case '\r':
			handleCRLF(c);
			// fallthrough
		case '\n':
			return T_NEWLINE;

		case EOF:
			return T_EOF;

		// Handle line continuations

		case '\\':
			// Macro args were handled by `peek`, and character escapes do not exist
			// outside of string literals, so this must be a line continuation.
			readLineContinuation();
			break;

		// Handle raw strings... or fall through if '#' is not followed by '"'

		case '#':
			if (peek() == '"') {
				shiftChar();
				readString(true);
				return T_STRING;
			}
			// fallthrough

		// Handle identifiers... or report garbage characters

		default:
			if (startsIdentifier(c)) {
				int tokenType = readIdentifier(c);

				// An ELIF after a taken IF needs to not evaluate its condition
				if (tokenType == T_POP_ELIF && lexerState->lastToken == T_NEWLINE
				 && lexer_GetIFDepth() > 0 && lexer_RanIFBlock()
				 && !lexer_ReachedELSEBlock())
					return yylex_SKIP_TO_ENDC();

				// If a keyword, don't try to expand
				if (tokenType != T_ID && tokenType != T_LOCAL_ID)
					return tokenType;

				// Local symbols cannot be string expansions
				if (tokenType == T_ID && lexerState->expandStrings) {
					// Attempt string expansion
					struct Symbol const *sym = sym_FindExactSymbol(yylval.symName);

					if (sym && sym->type == SYM_EQUS) {
						char const *s = sym_GetStringValue(sym);

						assert(s);
						if (s[0])
							beginExpansion(s, false, sym->name);
						continue; // Restart, reading from the new buffer
					}
				}

				if (tokenType == T_ID && (lexerState->atLineStart || peek() == ':'))
					return T_LABEL;

				return tokenType;
			}

			// Do not report weird characters when capturing, it'll be done later
			if (!lexerState->capturing) {
				// TODO: try to group reportings
				error("Unknown character %s\n", printChar(c));
			}
		}
		lexerState->atLineStart = false;
	}
}